

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

uint32_t cpu_ldl_data_mips64(CPUArchState_conflict10 *env,target_ulong ptr)

{
  uint32_t uVar1;
  target_ulong ptr_local;
  CPUArchState_conflict10 *env_local;
  
  uVar1 = cpu_ldl_data_ra_mips64(env,ptr,0);
  return uVar1;
}

Assistant:

uint32_t cpu_ldl_data(CPUArchState *env, target_ulong ptr)
{
    return cpu_ldl_data_ra(env, ptr, 0);
}